

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpDebugOut.c
# Opt level: O3

void printFmt(MessageType type,char *format,__va_list_tag *args)

{
  if (type != MESSAGETYPE_ERROR) {
    vfprintf(_stdout,format,args);
    return;
  }
  printFmt_cold_1();
  return;
}

Assistant:

void printFmt (MessageType type, const char* format, va_list args)
{
	FILE* out = getOutFile(type);

	if (type == MESSAGETYPE_ERROR)
		fprintf(out, "FATAL ERROR: ");

	vfprintf(out, format, args);

	if (type == MESSAGETYPE_ERROR)
	{
		putc('\n', out);
		fflush(out);
	}
}